

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_common_intrin.h
# Opt level: O2

__m128i convolve_lo_y_12tap(__m128i *s,__m128i *coeffs)

{
  undefined1 auVar1 [15];
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  __m128i alVar59;
  __m128i ss [6];
  __m128i local_68;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  undefined1 local_28 [16];
  undefined1 local_18 [16];
  
  alVar59 = *s;
  auVar6[0xd] = 0;
  auVar6._0_13_ = alVar59._0_13_;
  auVar6[0xe] = alVar59[0]._7_1_;
  auVar12[0xc] = alVar59[0]._6_1_;
  auVar12._0_12_ = alVar59._0_12_;
  auVar12._13_2_ = auVar6._13_2_;
  auVar18[0xb] = 0;
  auVar18._0_11_ = alVar59._0_11_;
  auVar18._12_3_ = auVar12._12_3_;
  auVar24[10] = alVar59[0]._5_1_;
  auVar24._0_10_ = alVar59._0_10_;
  auVar24._11_4_ = auVar18._11_4_;
  auVar30[9] = 0;
  auVar30._0_9_ = alVar59._0_9_;
  auVar30._10_5_ = auVar24._10_5_;
  auVar36[8] = alVar59[0]._4_1_;
  auVar36._0_8_ = alVar59[0];
  auVar36._9_6_ = auVar30._9_6_;
  auVar41._7_8_ = 0;
  auVar41._0_7_ = auVar36._8_7_;
  auVar47._1_8_ = SUB158(auVar41 << 0x40,7);
  auVar47[0] = alVar59[0]._3_1_;
  auVar47._9_6_ = 0;
  auVar48._1_10_ = SUB1510(auVar47 << 0x30,5);
  auVar48[0] = alVar59[0]._2_1_;
  auVar48._11_4_ = 0;
  local_68._3_12_ = SUB1512(auVar48 << 0x20,3);
  local_68[0]._2_1_ = alVar59[0]._1_1_;
  local_68[0]._0_2_ = (ushort)(byte)alVar59[0];
  local_68[1]._7_1_ = 0;
  alVar59 = s[2];
  auVar1[0xd] = 0;
  auVar1._0_13_ = alVar59._0_13_;
  auVar1[0xe] = alVar59[0]._7_1_;
  auVar7[0xc] = alVar59[0]._6_1_;
  auVar7._0_12_ = alVar59._0_12_;
  auVar7._13_2_ = auVar1._13_2_;
  auVar13[0xb] = 0;
  auVar13._0_11_ = alVar59._0_11_;
  auVar13._12_3_ = auVar7._12_3_;
  auVar19[10] = alVar59[0]._5_1_;
  auVar19._0_10_ = alVar59._0_10_;
  auVar19._11_4_ = auVar13._11_4_;
  auVar25[9] = 0;
  auVar25._0_9_ = alVar59._0_9_;
  auVar25._10_5_ = auVar19._10_5_;
  auVar31[8] = alVar59[0]._4_1_;
  auVar31._0_8_ = alVar59[0];
  auVar31._9_6_ = auVar25._9_6_;
  auVar42._7_8_ = 0;
  auVar42._0_7_ = auVar31._8_7_;
  auVar49._1_8_ = SUB158(auVar42 << 0x40,7);
  auVar49[0] = alVar59[0]._3_1_;
  auVar49._9_6_ = 0;
  auVar50._1_10_ = SUB1510(auVar49 << 0x30,5);
  auVar50[0] = alVar59[0]._2_1_;
  auVar50._11_4_ = 0;
  auVar37[2] = alVar59[0]._1_1_;
  auVar37._0_2_ = (ushort)alVar59[0];
  auVar37._3_12_ = SUB1512(auVar50 << 0x20,3);
  local_58._0_2_ = (ushort)alVar59[0] & 0xff;
  local_58._2_13_ = auVar37._2_13_;
  local_58[0xf] = 0;
  alVar59 = s[4];
  auVar2[0xd] = 0;
  auVar2._0_13_ = alVar59._0_13_;
  auVar2[0xe] = alVar59[0]._7_1_;
  auVar8[0xc] = alVar59[0]._6_1_;
  auVar8._0_12_ = alVar59._0_12_;
  auVar8._13_2_ = auVar2._13_2_;
  auVar14[0xb] = 0;
  auVar14._0_11_ = alVar59._0_11_;
  auVar14._12_3_ = auVar8._12_3_;
  auVar20[10] = alVar59[0]._5_1_;
  auVar20._0_10_ = alVar59._0_10_;
  auVar20._11_4_ = auVar14._11_4_;
  auVar26[9] = 0;
  auVar26._0_9_ = alVar59._0_9_;
  auVar26._10_5_ = auVar20._10_5_;
  auVar32[8] = alVar59[0]._4_1_;
  auVar32._0_8_ = alVar59[0];
  auVar32._9_6_ = auVar26._9_6_;
  auVar43._7_8_ = 0;
  auVar43._0_7_ = auVar32._8_7_;
  auVar51._1_8_ = SUB158(auVar43 << 0x40,7);
  auVar51[0] = alVar59[0]._3_1_;
  auVar51._9_6_ = 0;
  auVar52._1_10_ = SUB1510(auVar51 << 0x30,5);
  auVar52[0] = alVar59[0]._2_1_;
  auVar52._11_4_ = 0;
  local_48._3_12_ = SUB1512(auVar52 << 0x20,3);
  local_48[2] = alVar59[0]._1_1_;
  local_48[0] = (byte)alVar59[0];
  local_48[1] = 0;
  local_48[0xf] = 0;
  alVar59 = s[6];
  auVar3[0xd] = 0;
  auVar3._0_13_ = alVar59._0_13_;
  auVar3[0xe] = alVar59[0]._7_1_;
  auVar9[0xc] = alVar59[0]._6_1_;
  auVar9._0_12_ = alVar59._0_12_;
  auVar9._13_2_ = auVar3._13_2_;
  auVar15[0xb] = 0;
  auVar15._0_11_ = alVar59._0_11_;
  auVar15._12_3_ = auVar9._12_3_;
  auVar21[10] = alVar59[0]._5_1_;
  auVar21._0_10_ = alVar59._0_10_;
  auVar21._11_4_ = auVar15._11_4_;
  auVar27[9] = 0;
  auVar27._0_9_ = alVar59._0_9_;
  auVar27._10_5_ = auVar21._10_5_;
  auVar33[8] = alVar59[0]._4_1_;
  auVar33._0_8_ = alVar59[0];
  auVar33._9_6_ = auVar27._9_6_;
  auVar44._7_8_ = 0;
  auVar44._0_7_ = auVar33._8_7_;
  auVar53._1_8_ = SUB158(auVar44 << 0x40,7);
  auVar53[0] = alVar59[0]._3_1_;
  auVar53._9_6_ = 0;
  auVar54._1_10_ = SUB1510(auVar53 << 0x30,5);
  auVar54[0] = alVar59[0]._2_1_;
  auVar54._11_4_ = 0;
  auVar38[2] = alVar59[0]._1_1_;
  auVar38._0_2_ = (ushort)alVar59[0];
  auVar38._3_12_ = SUB1512(auVar54 << 0x20,3);
  local_38._0_2_ = (ushort)alVar59[0] & 0xff;
  local_38._2_13_ = auVar38._2_13_;
  local_38[0xf] = 0;
  alVar59 = s[8];
  auVar4[0xd] = 0;
  auVar4._0_13_ = alVar59._0_13_;
  auVar4[0xe] = alVar59[0]._7_1_;
  auVar10[0xc] = alVar59[0]._6_1_;
  auVar10._0_12_ = alVar59._0_12_;
  auVar10._13_2_ = auVar4._13_2_;
  auVar16[0xb] = 0;
  auVar16._0_11_ = alVar59._0_11_;
  auVar16._12_3_ = auVar10._12_3_;
  auVar22[10] = alVar59[0]._5_1_;
  auVar22._0_10_ = alVar59._0_10_;
  auVar22._11_4_ = auVar16._11_4_;
  auVar28[9] = 0;
  auVar28._0_9_ = alVar59._0_9_;
  auVar28._10_5_ = auVar22._10_5_;
  auVar34[8] = alVar59[0]._4_1_;
  auVar34._0_8_ = alVar59[0];
  auVar34._9_6_ = auVar28._9_6_;
  auVar45._7_8_ = 0;
  auVar45._0_7_ = auVar34._8_7_;
  auVar55._1_8_ = SUB158(auVar45 << 0x40,7);
  auVar55[0] = alVar59[0]._3_1_;
  auVar55._9_6_ = 0;
  auVar56._1_10_ = SUB1510(auVar55 << 0x30,5);
  auVar56[0] = alVar59[0]._2_1_;
  auVar56._11_4_ = 0;
  auVar39[2] = alVar59[0]._1_1_;
  auVar39._0_2_ = (ushort)alVar59[0];
  auVar39._3_12_ = SUB1512(auVar56 << 0x20,3);
  local_28._0_2_ = (ushort)alVar59[0] & 0xff;
  local_28._2_13_ = auVar39._2_13_;
  local_28[0xf] = 0;
  alVar59 = s[10];
  auVar5[0xd] = 0;
  auVar5._0_13_ = alVar59._0_13_;
  auVar5[0xe] = alVar59[0]._7_1_;
  auVar11[0xc] = alVar59[0]._6_1_;
  auVar11._0_12_ = alVar59._0_12_;
  auVar11._13_2_ = auVar5._13_2_;
  auVar17[0xb] = 0;
  auVar17._0_11_ = alVar59._0_11_;
  auVar17._12_3_ = auVar11._12_3_;
  auVar23[10] = alVar59[0]._5_1_;
  auVar23._0_10_ = alVar59._0_10_;
  auVar23._11_4_ = auVar17._11_4_;
  auVar29[9] = 0;
  auVar29._0_9_ = alVar59._0_9_;
  auVar29._10_5_ = auVar23._10_5_;
  auVar35[8] = alVar59[0]._4_1_;
  auVar35._0_8_ = alVar59[0];
  auVar35._9_6_ = auVar29._9_6_;
  auVar46._7_8_ = 0;
  auVar46._0_7_ = auVar35._8_7_;
  auVar57._1_8_ = SUB158(auVar46 << 0x40,7);
  auVar57[0] = alVar59[0]._3_1_;
  auVar57._9_6_ = 0;
  auVar58._1_10_ = SUB1510(auVar57 << 0x30,5);
  auVar58[0] = alVar59[0]._2_1_;
  auVar58._11_4_ = 0;
  auVar40[2] = alVar59[0]._1_1_;
  auVar40._0_2_ = (ushort)alVar59[0];
  auVar40._3_12_ = SUB1512(auVar58 << 0x20,3);
  local_18._0_2_ = (ushort)alVar59[0] & 0xff;
  local_18._2_13_ = auVar40._2_13_;
  local_18[0xf] = 0;
  alVar59 = convolve_12tap(&local_68,coeffs);
  alVar59[0] = alVar59[0];
  alVar59[1] = alVar59[1];
  return alVar59;
}

Assistant:

static inline __m128i convolve_lo_y_12tap(const __m128i *s,
                                          const __m128i *coeffs) {
  __m128i ss[6];
  const __m128i zero = _mm_setzero_si128();
  ss[0] = _mm_unpacklo_epi8(s[0], zero);
  ss[1] = _mm_unpacklo_epi8(s[2], zero);
  ss[2] = _mm_unpacklo_epi8(s[4], zero);
  ss[3] = _mm_unpacklo_epi8(s[6], zero);
  ss[4] = _mm_unpacklo_epi8(s[8], zero);
  ss[5] = _mm_unpacklo_epi8(s[10], zero);
  return convolve_12tap(ss, coeffs);
}